

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderSetNodeSize(ImGuiID node_id,ImVec2 size)

{
  void *pvVar1;
  float local_18;
  float fStack_14;
  
  pvVar1 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,node_id);
  if (pvVar1 != (void *)0x0) {
    local_18 = size.x;
    fStack_14 = size.y;
    if ((local_18 <= 0.0) || (fStack_14 <= 0.0)) {
      __assert_fail("size.x > 0.0f && size.y > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3ca8,"void ImGui::DockBuilderSetNodeSize(ImGuiID, ImVec2)");
    }
    *(float *)((long)pvVar1 + 0x50) = local_18;
    *(float *)((long)pvVar1 + 0x54) = fStack_14;
    *(float *)((long)pvVar1 + 0x58) = local_18;
    *(float *)((long)pvVar1 + 0x5c) = fStack_14;
    *(ushort *)((long)pvVar1 + 0xbc) = (ushort)*(undefined4 *)((long)pvVar1 + 0xbc) & 0xffc7 | 8;
  }
  return;
}

Assistant:

void ImGui::DockBuilderSetNodeSize(ImGuiID node_id, ImVec2 size)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);
    node->Size = node->SizeRef = size;
    node->AuthorityForSize = ImGuiDataAuthority_DockNode;
}